

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collide_device.cpp
# Opt level: O1

void embree::renderTileStandard
               (int taskIndex,int threadIndex,int *pixels,uint width,uint height,float time,
               ISPCCamera *camera,int numTilesX,int numTilesY)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Vec3fa color;
  uint local_5c;
  float local_48;
  float local_44;
  float local_40;
  ulong local_38;
  
  iVar1 = taskIndex / numTilesX;
  local_5c = iVar1 * 8;
  uVar2 = iVar1 * 8 + 8;
  if (uVar2 < height) {
    height = uVar2;
  }
  if (local_5c < height) {
    uVar2 = taskIndex % numTilesX << 3;
    uVar3 = (taskIndex % numTilesX) * 8 + 8;
    uVar4 = (ulong)uVar3;
    if (width <= uVar3) {
      uVar4 = (ulong)width;
    }
    uVar6 = (ulong)(iVar1 * width * 8);
    local_38 = (ulong)width;
    do {
      if (uVar2 < (uint)uVar4) {
        uVar5 = (ulong)uVar2;
        do {
          renderPixelStandard((embree *)&local_48,(float)(uVar5 & 0xffffffff),(float)local_5c,camera
                             );
          fVar7 = local_48;
          if (1.0 <= local_48) {
            fVar7 = 1.0;
          }
          fVar10 = 0.0;
          if (0.0 <= fVar7) {
            fVar10 = fVar7;
          }
          fVar7 = local_44;
          if (1.0 <= local_44) {
            fVar7 = 1.0;
          }
          fVar8 = 0.0;
          if (0.0 <= fVar7) {
            fVar8 = fVar7;
          }
          fVar7 = local_40;
          if (1.0 <= local_40) {
            fVar7 = 1.0;
          }
          fVar9 = 0.0;
          if (0.0 <= fVar7) {
            fVar9 = fVar7;
          }
          pixels[(uint)((int)uVar6 + (int)uVar5)] =
               (int)(long)(fVar8 * 255.0) * 0x100 + (int)(long)(fVar10 * 255.0) +
               (int)(long)(fVar9 * 255.0) * 0x10000;
          uVar5 = uVar5 + 1;
        } while (uVar5 < uVar4);
      }
      local_5c = local_5c + 1;
      uVar6 = uVar6 + local_38;
    } while (local_5c != height);
  }
  return;
}

Assistant:

void renderTileStandard(int taskIndex,
                        int threadIndex,
                        int* pixels,
                        const unsigned int width,
                        const unsigned int height,
                        const float time,
                        const ISPCCamera& camera,
                        const int numTilesX,
                        const int numTilesY)
{
  const int t = taskIndex;
  const unsigned int tileY = t / numTilesX;
  const unsigned int tileX = t - tileY * numTilesX;
  const unsigned int x0 = tileX * TILE_SIZE_X;
  const unsigned int x1 = min(x0+TILE_SIZE_X,width);
  const unsigned int y0 = tileY * TILE_SIZE_Y;
  const unsigned int y1 = min(y0+TILE_SIZE_Y,height);

  for (unsigned int y=y0; y<y1; y++) for (unsigned int x=x0; x<x1; x++)
  {
    Vec3fa color = renderPixelStandard((float)x,(float)y,camera);

    /* write color to framebuffer */
    unsigned int r = (unsigned int) (255.0f * clamp(color.x,0.0f,1.0f));
    unsigned int g = (unsigned int) (255.0f * clamp(color.y,0.0f,1.0f));
    unsigned int b = (unsigned int) (255.0f * clamp(color.z,0.0f,1.0f));
    pixels[y*width+x] = (b << 16) + (g << 8) + r;
  }
}